

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

TestMiniParseResult *
google::protobuf::internal::TcParser::TestMiniParse
          (TestMiniParseResult *__return_storage_ptr__,MessageLite *msg,char *ptr,ParseContext *ctx,
          TcFieldData data,TcParseTableBase *table,uint64_t hasbits)

{
  TailCallParseFunc p_Var1;
  FieldEntry *pFVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  uint7 uVar6;
  
  __return_storage_ptr__->found_entry = (FieldEntry *)0x0;
  __return_storage_ptr__->called_func = (TailCallParseFunc)0x0;
  *(undefined8 *)&__return_storage_ptr__->tag = 0;
  uVar5 = (ulong)(byte)*ptr;
  pcVar3 = ptr + 1;
  if (*ptr < '\0') {
    uVar6 = (uint7)((uVar5 << 0x39) >> 8);
    lVar4 = CONCAT71(uVar6,*pcVar3);
    if (*pcVar3 < '\0') {
      uVar6 = uVar6 >> 7 | (uint7)((ulong)(lVar4 << 0x39) >> 8);
      lVar4 = CONCAT71(uVar6,ptr[2]);
      if (ptr[2] < '\0') {
        uVar6 = uVar6 >> 7 | (uint7)((ulong)(lVar4 << 0x39) >> 8);
        lVar4 = CONCAT71(uVar6,ptr[3]);
        if (ptr[3] < '\0') {
          uVar6 = uVar6 >> 7 | (uint7)((ulong)(lVar4 << 0x39) >> 8);
          if (ptr[4] < '\0') {
            *(undefined8 *)&__return_storage_ptr__->tag = 0;
            __return_storage_ptr__->found_entry = (FieldEntry *)0x0;
            __return_storage_ptr__->called_func = Error;
            pcVar3 = Error(msg,(char *)msg,(ParseContext *)ptr,(TcFieldData)ctx,table,hasbits);
            goto LAB_00369414;
          }
          uVar5 = CONCAT71(uVar6,ptr[4]) << 0x1c | (ulong)(uVar6 >> 0x1c);
          pcVar3 = ptr + 5;
        }
        else {
          uVar5 = lVar4 << 0x15 | (ulong)(uVar6 >> 0x23);
          pcVar3 = ptr + 4;
        }
      }
      else {
        uVar5 = lVar4 << 0xe | (ulong)(uVar6 >> 0x2a);
        pcVar3 = ptr + 3;
      }
    }
    else {
      uVar5 = lVar4 << 7 | (ulong)(uVar6 >> 0x31);
      pcVar3 = ptr + 2;
    }
  }
  pFVar2 = FindFieldEntry(table,(uint)(uVar5 >> 3) & 0x1fffffff);
  if (pFVar2 == (FieldEntry *)0x0) {
    p_Var1 = table->fallback;
    __return_storage_ptr__->called_func = p_Var1;
    __return_storage_ptr__->tag = (uint32_t)uVar5;
    __return_storage_ptr__->found_entry = (FieldEntry *)0x0;
    pcVar3 = (*p_Var1)(msg,pcVar3,ctx,(TcFieldData)(uVar5 & 0xffffffff),table,hasbits);
  }
  else {
    p_Var1 = *(TailCallParseFunc *)
              (MiniParse<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)
               ::kMiniParseTable + (ulong)(pFVar2->type_card & 0xf) * 8);
    __return_storage_ptr__->called_func = p_Var1;
    __return_storage_ptr__->tag = (uint32_t)uVar5;
    __return_storage_ptr__->found_entry = pFVar2;
    pcVar3 = (*p_Var1)(msg,pcVar3,ctx,
                       (TcFieldData)
                       (uVar5 & 0xffffffff | (ulong)(uint)((int)pFVar2 - (int)table) << 0x20),table,
                       hasbits);
  }
LAB_00369414:
  __return_storage_ptr__->ptr = pcVar3;
  return __return_storage_ptr__;
}

Assistant:

PROTOBUF_NOINLINE TcParser::TestMiniParseResult TcParser::TestMiniParse(
    PROTOBUF_TC_PARAM_DECL) {
  TestMiniParseResult result = {};
  data.data = reinterpret_cast<uintptr_t>(&result);
  result.ptr = MiniParse<true>(PROTOBUF_TC_PARAM_PASS);
  return result;
}